

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp.h
# Opt level: O0

void csp_bind_lambda(CSP *csp,char *name,function<void_(int)> *fn)

{
  bool bVar1;
  unique_lock<std::mutex> *this;
  function<void_(int)> *in_RDX;
  long in_RSI;
  long in_RDI;
  unique_lock<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffff78;
  unique_lock<std::mutex> *in_stack_ffffffffffffff80;
  function<void_(int)> *in_stack_ffffffffffffffa0;
  allocator<char> *in_stack_ffffffffffffffb0;
  key_type *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  
  if (((in_RDI != 0) && (in_RSI != 0)) &&
     (bVar1 = std::function::operator_cast_to_bool((function<void_(int)> *)0x11758b), bVar1)) {
    std::unique_lock<std::mutex>::unique_lock(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    this = (unique_lock<std::mutex> *)(in_RDI + 0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0
              );
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(int)>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(int)>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(int)>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(int)>_>_>_>
                  *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    std::function<void_(int)>::operator=(in_stack_ffffffffffffffa0,in_RDX);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffb7);
    std::unique_lock<std::mutex>::~unique_lock(this);
  }
  return;
}

Assistant:

void csp_bind_lambda(CSP* csp, char const*const name, std::function<void(int)> fn)
{
    if (!csp || !name || !fn)
        return;

    // guard against adding processes, or changing them
    std::unique_lock<std::mutex> lock(csp->process_data_mutex);
    csp->lambdas[name] = fn;
}